

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::MatrixAccumulator::getVariance(MatrixAccumulator *this,ResultType *ret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  RectMatrix<double,_3U,_3U> *in_RSI;
  long in_RDI;
  uint j;
  uint i;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0xa0),local_14,local_18);
      dVar1 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x58),local_14,local_18);
      dVar2 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x58),local_14,local_18);
      dVar3 = *pdVar4;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      *pdVar4 = -dVar2 * dVar3 + dVar1;
      pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      if (*pdVar4 <= 0.0 && *pdVar4 != 0.0) {
        pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
        *pdVar4 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void getVariance(ResultType& ret) {
      assert(Count_ != 0);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = (Avg2_(i, j) - Avg_(i, j) * Avg_(i, j));
          if (ret(i, j) < 0) ret(i, j) = 0;
        }
      }
      return;
    }